

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O3

size_t suboptimality(svm_model *model,double *subopt)

{
  svm_example *psVar1;
  size_t sVar2;
  size_t sVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  
  if (model->num_support == 0) {
    return 0;
  }
  dVar4 = 0.0;
  sVar2 = 0;
  sVar3 = 0;
  do {
    psVar1 = (model->support_vec)._begin[sVar3];
    fVar6 = (model->alpha)._begin[sVar3] * (psVar1->ex).l.simple.label;
    if (((psVar1->ex).l.simple.weight <= fVar6) ||
       (fVar7 = (model->delta)._begin[sVar3], 0.0 <= fVar7)) {
      dVar5 = 0.0;
      if ((0.0 < fVar6) && (fVar7 = (model->delta)._begin[sVar3], dVar5 = 0.0, 0.0 < fVar7))
      goto LAB_001fa1ff;
    }
    else {
LAB_001fa1ff:
      dVar5 = (double)ABS(fVar7);
    }
    subopt[sVar3] = dVar5;
    if (dVar4 < dVar5) {
      sVar2 = sVar3;
      dVar4 = dVar5;
    }
    sVar3 = sVar3 + 1;
    if (model->num_support <= sVar3) {
      return sVar2;
    }
  } while( true );
}

Assistant:

size_t suboptimality(svm_model* model, double* subopt)
{
  size_t max_pos = 0;
  // cerr<<"Subopt ";
  double max_val = 0;
  for (size_t i = 0; i < model->num_support; i++)
  {
    float tmp = model->alpha[i] * model->support_vec[i]->ex.l.simple.label;

    if ((tmp < model->support_vec[i]->ex.l.simple.weight && model->delta[i] < 0) || (tmp > 0 && model->delta[i] > 0))
      subopt[i] = fabs(model->delta[i]);
    else
      subopt[i] = 0;

    if (subopt[i] > max_val)
    {
      max_val = subopt[i];
      max_pos = i;
    }
    // cerr<<subopt[i]<<" ";
  }
  // cerr<<endl;
  return max_pos;
}